

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O2

bool __thiscall QPDFTokenizer::Token::isWord(Token *this,string *value)

{
  __type_conflict1 _Var1;
  
  if (this->type == tt_word) {
    _Var1 = std::operator==(&this->value,value);
    return _Var1;
  }
  return false;
}

Assistant:

bool
        isWord(std::string const& value) const
        {
            return this->type == tt_word && this->value == value;
        }